

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neldermead.c
# Opt level: O3

int nel_min(custom_function *funcpt,double *xc,int N,double *dx,double fsval,int MAXITER,int *niter,
           double eps,double *xf)

{
  size_t sVar1;
  double dVar2;
  long lVar3;
  double *__ptr;
  double *__ptr_00;
  void *__ptr_01;
  double *__src;
  double *__src_00;
  double *__ptr_02;
  void *__dest;
  double *__dest_00;
  double *__dest_01;
  ulong uVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_6c;
  double local_48;
  uint local_38;
  int local_34;
  
  uVar11 = N + 1;
  *niter = 0;
  lVar3 = (long)N;
  sVar1 = lVar3 * 8;
  __ptr = (double *)malloc(sVar1 * (long)(int)uVar11);
  __ptr_00 = (double *)malloc((long)(int)uVar11 << 3);
  __ptr_01 = malloc(sVar1);
  __src = (double *)malloc(sVar1);
  __src_00 = (double *)malloc(sVar1);
  __ptr_02 = (double *)malloc(sVar1);
  __dest = malloc(sVar1);
  __dest_00 = (double *)malloc(sVar1);
  __dest_01 = (double *)malloc(sVar1);
  uVar10 = (ulong)(uint)N;
  sVar1 = uVar10 * 8;
  if (0 < N) {
    memcpy(__dest_00,xc,sVar1);
  }
  uVar9 = (ulong)uVar11;
  dVar15 = 1.0;
  dVar17 = 1.0;
  local_38 = N * N;
  do {
    if (MAXITER <= *niter) break;
    if (N < 1) {
      dVar16 = (*funcpt->funcpt)(__dest_00,N,funcpt->params);
      __ptr_00[lVar3] = dVar16;
      local_48 = *__ptr_00;
      local_38 = 0;
      local_34 = 0;
    }
    else {
      memcpy(__ptr + (int)local_38,__dest_00,sVar1);
      dVar16 = (*funcpt->funcpt)(__dest_00,N,funcpt->params);
      __ptr_00[lVar3] = dVar16;
      uVar7 = 0;
      pdVar5 = __ptr;
      do {
        __dest_00[uVar7] = dx[uVar7] * dVar15 + __dest_00[uVar7];
        memcpy(pdVar5,__dest_00,sVar1);
        dVar16 = (*funcpt->funcpt)(__dest_00,N,funcpt->params);
        __ptr_00[uVar7] = dVar16;
        __dest_00[uVar7] = __dest_00[uVar7] - dx[uVar7] * dVar15;
        uVar7 = uVar7 + 1;
        pdVar5 = pdVar5 + uVar10;
      } while (uVar10 != uVar7);
      local_48 = *__ptr_00;
      if (N < 1) {
        local_38 = 0;
        local_34 = 0;
      }
      else {
        uVar7 = 0;
        uVar4 = 1;
        do {
          if (__ptr_00[uVar4] < local_48) {
            uVar7 = uVar4 & 0xffffffff;
            local_48 = __ptr_00[uVar4];
          }
          uVar4 = uVar4 + 1;
        } while (uVar9 != uVar4);
        local_34 = (int)uVar7;
        local_38 = local_34 * N;
        if (0 < N) {
          memcpy(__dest,__ptr + (int)local_38,sVar1);
        }
      }
    }
    local_6c = 0;
    if (eps < ABS(dVar17)) {
      iVar6 = *niter;
      local_6c = 0;
      if (iVar6 < MAXITER) {
        local_6c = 0;
        do {
          *niter = iVar6 + 1;
          dVar17 = *__ptr_00;
          iVar6 = 0;
          if (N < 1) {
LAB_001436b1:
            local_38 = iVar6 * N;
          }
          else {
            uVar4 = 0;
            uVar7 = 1;
            dVar16 = dVar17;
            do {
              dVar18 = __ptr_00[uVar7];
              if (dVar16 < dVar18) {
                uVar4 = uVar7 & 0xffffffff;
              }
              iVar6 = (int)uVar4;
              if (dVar18 <= dVar16) {
                dVar18 = dVar16;
              }
              dVar16 = dVar18;
              uVar7 = uVar7 + 1;
            } while (uVar9 != uVar7);
            if (N < 1) goto LAB_001436b1;
            local_38 = iVar6 * N;
            uVar7 = 0;
            pdVar5 = __ptr;
            do {
              dVar16 = 0.0;
              uVar4 = uVar9;
              pdVar8 = pdVar5;
              do {
                dVar16 = dVar16 + *pdVar8;
                pdVar8 = pdVar8 + uVar10;
                uVar4 = uVar4 - 1;
              } while (uVar4 != 0);
              *(double *)((long)__ptr_01 + uVar7 * 8) =
                   (dVar16 - __ptr[(long)(int)local_38 + uVar7]) / (double)N;
              uVar7 = uVar7 + 1;
              pdVar5 = pdVar5 + 1;
            } while (uVar7 != uVar10);
            if (0 < N) {
              uVar7 = 0;
              do {
                dVar16 = *(double *)((long)__ptr_01 + uVar7 * 8);
                __src[uVar7] = (dVar16 + dVar16) - __ptr[(long)(int)local_38 + uVar7];
                uVar7 = uVar7 + 1;
              } while (uVar10 != uVar7);
            }
          }
          dVar16 = (*funcpt->funcpt)(__src,N,funcpt->params);
          if (local_48 <= dVar16) {
            if (N < 0) {
LAB_00143811:
              dVar18 = (*funcpt->funcpt)(__src_00,N,funcpt->params);
              if (dVar18 <= __ptr_00[iVar6]) {
                if (0 < N) {
                  memcpy(__ptr + (int)local_38,__src_00,sVar1);
                }
                __ptr_00[iVar6] = dVar18;
              }
              else {
                local_34 = 0;
                local_48 = dVar17;
                if (-1 < N) {
                  uVar7 = 0;
                  pdVar5 = __ptr;
                  do {
                    if (0 < N) {
                      uVar4 = 0;
                      do {
                        dVar17 = (pdVar5[uVar4] + *(double *)((long)__dest + uVar4 * 8)) * 0.5;
                        pdVar5[uVar4] = dVar17;
                        __ptr_02[uVar4] = dVar17;
                        uVar4 = uVar4 + 1;
                      } while (uVar10 != uVar4);
                    }
                    dVar17 = (*funcpt->funcpt)(__ptr_02,N,funcpt->params);
                    __ptr_00[uVar7] = dVar17;
                    uVar7 = uVar7 + 1;
                    pdVar5 = pdVar5 + uVar10;
                  } while (uVar7 != uVar9);
                  if (0 < N) {
                    local_34 = 0;
                    uVar7 = 1;
                    dVar17 = *__ptr_00;
                    do {
                      local_48 = __ptr_00[uVar7];
                      iVar12 = (int)uVar7;
                      if (dVar17 <= local_48) {
                        local_48 = dVar17;
                        iVar12 = local_34;
                      }
                      local_34 = iVar12;
                      uVar7 = uVar7 + 1;
                      dVar17 = local_48;
                    } while (uVar9 != uVar7);
                    uVar13 = 0;
                    if (0 < N) {
                      memcpy(__dest,__ptr + local_34 * N,sVar1);
                    }
                    goto LAB_00143ad2;
                  }
                  local_34 = 0;
                  local_48 = *__ptr_00;
                }
              }
              uVar13 = 0;
LAB_00143ad2:
              if (uVar13 < 2) {
                dVar16 = __ptr_00[iVar6];
                goto LAB_00143b23;
              }
            }
            else {
              uVar7 = 0;
              iVar12 = 0;
              do {
                iVar12 = iVar12 + (uint)(dVar16 < __ptr_00[uVar7]);
                uVar7 = uVar7 + 1;
              } while (uVar9 != uVar7);
              if (iVar12 == 1) {
                if (0 < N) {
                  uVar7 = 0;
                  do {
                    __src_00[uVar7] =
                         __ptr[(long)(int)local_38 + uVar7] * 0.5 +
                         *(double *)((long)__ptr_01 + uVar7 * 8) * 0.5;
                    uVar7 = uVar7 + 1;
                  } while (uVar10 != uVar7);
                }
                dVar17 = (*funcpt->funcpt)(__src_00,N,funcpt->params);
                if (dVar17 <= dVar16) {
                  if (0 < N) {
                    memcpy(__ptr + (int)local_38,__src_00,sVar1);
                  }
                  __ptr_00[iVar6] = dVar17;
                }
                else {
                  if (0 < N) {
                    memcpy(__ptr + (int)local_38,__src,sVar1);
                  }
                  __ptr_00[iVar6] = dVar16;
                }
                uVar13 = 1;
                goto LAB_00143ad2;
              }
              if (iVar12 == 0) {
                if (0 < N) {
                  uVar7 = 0;
                  do {
                    __src_00[uVar7] =
                         __ptr[(long)(int)local_38 + uVar7] * 0.5 +
                         *(double *)((long)__ptr_01 + uVar7 * 8) * 0.5;
                    uVar7 = uVar7 + 1;
                  } while (uVar10 != uVar7);
                }
                goto LAB_00143811;
              }
            }
            if (0 < N) {
              memcpy(__ptr + (int)local_38,__src,sVar1);
            }
            __ptr_00[iVar6] = dVar16;
          }
          else {
            if (0 < N) {
              uVar7 = 0;
              do {
                __src_00[uVar7] =
                     (__src[uVar7] + __src[uVar7]) - *(double *)((long)__ptr_01 + uVar7 * 8);
                uVar7 = uVar7 + 1;
              } while (uVar10 != uVar7);
            }
            dVar17 = (*funcpt->funcpt)(__src_00,N,funcpt->params);
            if (dVar16 <= dVar17) {
              if (0 < N) {
                memcpy(__ptr + (int)local_38,__src,sVar1);
              }
              __ptr_00[iVar6] = dVar16;
            }
            else {
              if (0 < N) {
                memcpy(__ptr + (int)local_38,__src_00,sVar1);
              }
              __ptr_00[iVar6] = dVar17;
              dVar16 = dVar17;
            }
          }
LAB_00143b23:
          if (dVar16 < local_48) {
            local_34 = iVar6;
          }
          if (N < 0) {
            dVar17 = 0.0;
          }
          else {
            dVar18 = 0.0;
            uVar7 = 0;
            do {
              dVar18 = dVar18 + __ptr_00[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar9 != uVar7);
            if (N < 0) {
              dVar17 = 0.0;
            }
            else {
              dVar17 = 0.0;
              uVar7 = 0;
              do {
                dVar2 = __ptr_00[uVar7] - dVar18 / (double)(int)uVar11;
                dVar17 = dVar17 + dVar2 * dVar2;
                uVar7 = uVar7 + 1;
              } while (uVar9 != uVar7);
            }
          }
          if (dVar17 < 0.0) {
            dVar17 = sqrt(dVar17);
          }
          else {
            dVar17 = SQRT(dVar17);
          }
          if (ABS(dVar17) < eps) {
            local_6c = 1;
          }
          if (ABS(dVar17) <= eps) break;
          if (local_48 <= dVar16) {
            dVar16 = local_48;
          }
          iVar6 = *niter;
          local_48 = dVar16;
        } while (iVar6 < MAXITER);
      }
      local_38 = local_34 * N;
    }
    if (N < 1) {
      dVar16 = 0.001;
      if (local_6c != 0) {
        dVar16 = dVar15;
      }
      dVar15 = dVar16;
      dVar16 = 1.0;
      if (local_6c != 0) {
        dVar16 = dVar17;
      }
    }
    else {
      memcpy(__dest_01,__ptr + (int)local_38,sVar1);
      dVar16 = __ptr_00[local_34];
      iVar6 = local_6c + N * 2;
      uVar7 = 0;
      while( true ) {
        dVar15 = dx[uVar7] * 0.001;
        __dest_01[uVar7] = __dest_01[uVar7] + dVar15;
        dVar18 = (*funcpt->funcpt)(__dest_01,N,funcpt->params);
        local_6c = 0;
        if (dVar18 < dVar16) break;
        __dest_01[uVar7] = __dest_01[uVar7] - (dVar15 + dVar15);
        dVar18 = (*funcpt->funcpt)(__dest_01,N,funcpt->params);
        if ((dVar18 < dVar16) || (uVar7 = uVar7 + 1, local_6c = iVar6, uVar10 == uVar7)) break;
      }
      bVar14 = local_6c == 0;
      if (bVar14) {
        dVar15 = 0.001;
      }
      local_88 = SUB84(dVar17,0);
      uStack_84 = (undefined4)((ulong)dVar17 >> 0x20);
      if (bVar14) {
        local_88 = 0;
        uStack_84 = 0x3ff00000;
      }
      dVar16 = (double)CONCAT44(uStack_84,local_88);
      if (bVar14 && 0 < N) {
        memcpy(__dest_00,__dest_01,sVar1);
        local_6c = 0;
        dVar15 = 0.001;
        dVar16 = 1.0;
      }
    }
    dVar17 = dVar16;
  } while (local_6c == 0);
  if (0 < N) {
    memcpy(xf,__ptr + (uint)(N * N),sVar1);
  }
  iVar6 = *niter;
  free(__ptr_00);
  free(__ptr);
  free(__ptr_01);
  free(__src);
  free(__src_00);
  free(__ptr_02);
  free(__dest);
  free(__dest_00);
  free(__dest_01);
  return (uint)(MAXITER <= iVar6) * 3 + 1;
}

Assistant:

int nel_min(custom_function *funcpt,double *xc,int N,double *dx,double fsval,int MAXITER,int *niter,
		double eps,double *xf) {
	int rcode,NN,i,j,ct,ctl;
	int ihi,ilo,L,siter;
	double reqmin,rcoeff,ecoeff,ccoeff,fn,del;
	double ylo,ynl,temp,ys,yss;
	double *P,*Y,*PB,*PS,*PSS,*PM,*PL,*xi,*xmin;
	double ysum,yavg,s,dval;

	rcode = 0;
	reqmin = eps;
	rcoeff = 1.0;
	ecoeff = 2.0;
	ccoeff = 0.5;
	del = 1.0;
	NN = N + 1;
	ct = N * N;
	*niter = 0;
	siter = MAXITER;
	s = 1.0;
	ctl = 0;
	dval = 1.0e-03;

	P = (double*) malloc(sizeof(double) * N * NN);
	Y = (double*) malloc(sizeof(double) * NN);
	PB = (double*) malloc(sizeof(double) * N);
	PS = (double*) malloc(sizeof(double) * N);
	PSS = (double*) malloc(sizeof(double) * N);
	PM = (double*) malloc(sizeof(double) * N);
	PL = (double*) malloc(sizeof(double) * N);
	xi = (double*) malloc(sizeof(double) * N);
	xmin = (double*) malloc(sizeof(double) * N);

	for (i = 0; i < N;++i) {
		xi[i] = xc[i];
	}

	while (ctl == 0 && *niter < siter) {
		// Create N+1 point Simplex
		for (i = 0; i < N;++i) {
			P[ct + i] = xi[i];
		}

		fn = FUNCPT_EVAL(funcpt,xi,N);
		Y[N] = fn;


		for (i = 0; i < N;++i) {
			xi[i] += dx[i] * del;
			ct = i * N;
			for (j = 0; j < N;++j) {
				P[ct + j] = xi[j];
			}
			fn = FUNCPT_EVAL(funcpt, xi, N);
			Y[i] = fn;
			xi[i] -= dx[i] * del;
		}

		ylo = Y[0];
		ilo = 0;

		for (i = 1; i < NN;++i) {

			if (Y[i] < ylo) {
				ylo = Y[i];
				ilo = i;
			}
		}

		ct = ilo * N;

		for (i = 0; i < N;++i) {
			PL[i] = P[ct + i];
		}


		while (fabs(s) > reqmin && *niter < siter) {
			*niter = *niter + 1;

			// Find highest and lowest function values.

			ynl = Y[0];
			ihi = 0;

			for (i = 1; i < NN;++i) {

				if (Y[i] > ynl) {
					ynl = Y[i];
					ihi = i;
				}

			}


			// Find PB [Centroid]
			ct = N;
			for(i = 0; i < N;i++) {
				temp = 0.0;
				for ( j = 0; j < NN;++j) {
					temp += P[j*ct+i];
				}
				temp -= P[ihi*ct+i];
				PB[i] = temp / (double) N;
			}

			// Find reflection
			ct = ihi * N;
			for (i = 0; i < N;++i) {
				PS[i] = (1.0 + rcoeff) * PB[i] - rcoeff * P[ct+i];
			}
			ys = FUNCPT_EVAL(funcpt, PS, N);

			if (ys < ylo) {
				for (i = 0; i < N;++i) {
					PSS[i] = ecoeff * PS[i] + (1.0 - ecoeff) * PB[i];
				}
				yss = FUNCPT_EVAL(funcpt, PSS, N);

				if (yss < ys) {
					for(i = 0; i < N;++i) {
						P[ct + i] = PSS[i];
					}
					Y[ihi] = yss;
				} else {
					for(i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;
				}


			} else {
				L = 0;
				for (i = 0; i < NN;++i) {
					if (Y[i] > ys) {
						L++;
					}
				}
	/*
				if (L == 1) {
					for ( i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;
				}*/
				if (L == 0) {
					for (i = 0; i < N;++i) {
						PSS[i] = ccoeff * P[ct + i] + (1.0 - ccoeff) * PB[i];
					}
					yss = FUNCPT_EVAL(funcpt, PSS, N);

					if (yss <= Y[ihi]) {
						for(i = 0; i < N;++i) {
							P[ct + i] = PSS[i];
						}
						Y[ihi] = yss;

					} else {

						//ctl = ilo * N;
						for(i = 0; i < NN;++i) {
							ct = i * N;
							for (j = 0;j < N;++j) {
								P[ct + j] = 0.5 * (P[ct + j] + PL[j]);
								PM[j] = P[ct + j];
							}
							Y[i] = FUNCPT_EVAL(funcpt, PM, N);

						}
						ylo = Y[0];
						ilo = 0;

						for (i = 1; i < NN;++i) {

							if (Y[i] < ylo) {
								ylo = Y[i];
								ilo = i;
							}

						}
						ct = ilo * N;

						for (i = 0; i < N;++i) {
							PL[i] = P[ct + i];
						}
					}
				}
				if (L == 1) {
					for (i = 0; i < N;++i) {
						PSS[i] = ccoeff * P[ct + i] + (1.0 - ccoeff) * PB[i];
					}
					yss = FUNCPT_EVAL(funcpt, PSS, N);

					if (yss <= ys) {
						ct = ihi * N;
						for(i = 0; i < N;++i) {
							P[ct + i] = PSS[i];
						}
						Y[ihi] = yss;

					} else {
						ct = ihi * N;
						for(i = 0; i < N;++i) {
							P[ct + i] = PS[i];
						}
						Y[ihi] = ys;

					}

				}


				if (L > 1) {
					ct = ihi * N;
					for(i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;

				}
			}

			if (Y[ihi] < ylo) {
				ylo = Y[ihi];
				ilo = ihi;
			}

			//To the end of the loop
			ysum = 0.0;
			for (j=0 ;j <= N;j++) {
				ysum += Y[j];
			}
			yavg = ysum/(N+1);
			s = 0.0;
			for (j=0;j<=N;j++) {
				s += pow((Y[j]-yavg),2.0);
			}
			s = sqrt(s);//Remove this statement if you want convergence in fewer iterations
			if (fabs(s) < reqmin) {
				ctl = 1;
			}

		}
		ct = ilo * N;
		for(i = 0; i < N;++i) {
			xmin[i] = P[ct + i];
		}
		ynl = Y[ilo];

		for (i = 0; i < N;++i) {
			del = dx[i] * dval;
			xmin[i] += del;
			fn = FUNCPT_EVAL(funcpt, xmin, N);
			if (fn < ynl) {
				ctl = 0;
				break;
			} else {
				ctl++;
			}
			xmin[i] = xmin[i] - 2 * del;
			fn = FUNCPT_EVAL(funcpt, xmin, N);
			if (fn < ynl) {
				ctl = 0;
				break;
			} else {
				ctl++;
			}
		}

		if (ctl == 0) {
			for (i = 0; i < N;++i) {
				xi[i] = xmin[i];
			}
			del = dval;
			s = 1.0;
		}

	}

	ct = N * N;
	for (i = 0; i < N;++i) {
		xf[i] = P[ct + i];
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	} else if (*niter < siter) {
		rcode = 1;
	}


	free(Y);
	free(P);
	free(PB);
	free(PS);
	free(PSS);
	free(PM);
	free(PL);
	free(xi);
	free(xmin);
	return rcode;
}